

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O2

TempGuestArenaAllocatorObject * __thiscall
ThreadContext::GetTemporaryGuestAllocator(ThreadContext *this,LPCWSTR name)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  RecyclableData *pRVar5;
  TempArenaAllocatorWrapper<true> *pTVar6;
  
  BVar3 = ExceptionCheck::CanHandleOutOfMemory();
  if (BVar3 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                       ,0x922,"(ExceptionCheck::CanHandleOutOfMemory())",
                       "ExceptionCheck::CanHandleOutOfMemory()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  if (this->temporaryGuestArenaAllocatorCount != 0) {
    this->temporaryGuestArenaAllocatorCount = this->temporaryGuestArenaAllocatorCount - 1;
    pRVar5 = Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::operator->
                       (&this->recyclableData);
    pTVar6 = pRVar5->temporaryGuestArenaAllocators[this->temporaryGuestArenaAllocatorCount].ptr;
    Js::TempArenaAllocatorWrapper<true>::AdviseInUse(pTVar6);
    pRVar5 = Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::operator->
                       (&this->recyclableData);
    pRVar5->temporaryGuestArenaAllocators[this->temporaryGuestArenaAllocatorCount].ptr =
         (TempArenaAllocatorWrapper<true> *)0x0;
    return pTVar6;
  }
  pTVar6 = Js::TempArenaAllocatorWrapper<true>::Create(this);
  return pTVar6;
}

Assistant:

Js::TempGuestArenaAllocatorObject *
ThreadContext::GetTemporaryGuestAllocator(LPCWSTR name)
{
    AssertCanHandleOutOfMemory();

    if (temporaryGuestArenaAllocatorCount != 0)
    {
        temporaryGuestArenaAllocatorCount--;
        Js::TempGuestArenaAllocatorObject * allocator = recyclableData->temporaryGuestArenaAllocators[temporaryGuestArenaAllocatorCount];
        allocator->AdviseInUse();
        recyclableData->temporaryGuestArenaAllocators[temporaryGuestArenaAllocatorCount] = nullptr;
        return allocator;
    }

    return Js::TempGuestArenaAllocatorObject::Create(this);
}